

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::_InternalParse
          (CustomModel_CustomModelParamValue *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint32_t value;
  uint64_t uVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  double value_00;
  string *str_1;
  string *str;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  CustomModel_CustomModelParamValue *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
LAB_00484d1c:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)
                google::protobuf::internal::ReadTag
                          ((char *)ctx_local,(uint32_t *)((long)&str + 4),0);
    tag_00 = str._4_4_;
    switch(str._4_4_ >> 3) {
    case 10:
      if ((str._4_4_ & 0xff) == 0x51) {
        value_00 = google::protobuf::internal::UnalignedLoad<double>((char *)ctx_local);
        _internal_set_doublevalue(this,value_00);
        ctx_local = (ParseContext *)&(ctx_local->super_EpsCopyInputStream).buffer_end_;
        goto LAB_00484d1c;
      }
      break;
    default:
      break;
    case 0x14:
      if ((str._4_4_ & 0xff) != 0xa2) break;
      psVar3 = _internal_mutable_stringvalue_abi_cxx11_(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::InlineGreedyStringParser
                            (psVar3,(char *)ctx_local,pPStack_20);
      bVar1 = google::protobuf::internal::VerifyUTF8(psVar3,(char *)0x0);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return (char *)0x0;
      }
      goto joined_r0x00484f1a;
    case 0x1e:
      if ((str._4_4_ & 0xff) == 0xf0) {
        value = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
        _internal_set_intvalue(this,value);
        goto joined_r0x00484f1a;
      }
      break;
    case 0x28:
      if ((str._4_4_ & 0xff) == 0x40) {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        _internal_set_longvalue(this,uVar2);
        goto joined_r0x00484f1a;
      }
      break;
    case 0x32:
      if ((str._4_4_ & 0xff) == 0x90) {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        _internal_set_boolvalue(this,uVar2 != 0);
        goto joined_r0x00484f1a;
      }
      break;
    case 0x3c:
      if ((str._4_4_ & 0xff) == 0xe2) {
        psVar3 = _internal_mutable_bytesvalue_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar3,(char *)ctx_local,pPStack_20);
        goto joined_r0x00484f1a;
      }
    }
    if ((str._4_4_ == 0) || ((str._4_4_ & 7) == 4)) {
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      google::protobuf::internal::EpsCopyInputStream::SetLastTag
                (&pPStack_20->super_EpsCopyInputStream,str._4_4_);
      return (char *)ctx_local;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>
                        (&(this->super_MessageLite)._internal_metadata_);
    ctx_local = (ParseContext *)
                google::protobuf::internal::UnknownFieldParse
                          (tag_00,unknown,(char *)ctx_local,pPStack_20);
joined_r0x00484f1a:
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* CustomModel_CustomModelParamValue::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // double doubleValue = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 81)) {
          _internal_set_doublevalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // string stringValue = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          auto str = _internal_mutable_stringvalue();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 intValue = 30;
      case 30:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 240)) {
          _internal_set_intvalue(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int64 longValue = 40;
      case 40:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 64)) {
          _internal_set_longvalue(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool boolValue = 50;
      case 50:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 144)) {
          _internal_set_boolvalue(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bytes bytesValue = 60;
      case 60:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 226)) {
          auto str = _internal_mutable_bytesvalue();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}